

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeInternalForces
          (ChElementTetraCorot_10 *this,ChVectorDynamic<> *Fi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  Index size;
  DstEvaluatorType dstEvaluator;
  char *__function;
  Index index_1;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChVectorDynamic<> displ;
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> FiR_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  assign_op<double,_double> local_f9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  undefined1 local_e8 [16];
  variable_if_dynamic<long,__1> vStack_d8;
  scalar_constant_op<double> sStack_d0;
  ChMatrixDynamic<> *local_c8;
  RhsNested local_c0;
  Index IStack_b8;
  variable_if_dynamic<long,__1> local_b0;
  scalar_constant_op<double> local_a0;
  RhsNested local_98;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  double local_68;
  double local_60;
  ChMatrixRef local_58;
  
  lVar10 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar5 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])();
  if (lVar10 != iVar5) {
    __assert_fail("Fi.size() == GetNdofs()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_10.cpp"
                  ,0x24a,
                  "virtual void chrono::fea::ChElementTetraCorot_10::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  iVar5 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,(long)iVar5);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[9])(this,&local_118);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_118.m_storage.m_rows) {
LAB_006c2191:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_f8,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar8 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_rows;
  if (local_f8.m_storage.m_rows != uVar8) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,uVar8,1);
  }
  if (-1 < local_f8.m_storage.m_rows) {
    if (local_f8.m_storage.m_rows != 0) {
      memset(local_f8.m_storage.m_data,0,local_f8.m_storage.m_rows << 3);
    }
    local_e8._0_8_ = 0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_f8,&this->StiffnessMatrix,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_118,(Scalar *)local_e8);
    pdVar11 = local_118.m_storage.m_data;
    if (local_118.m_storage.m_rows < 3) {
LAB_006c2172:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    peVar4 = (((this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar14._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar14._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar25._8_8_ = dVar2;
    auVar25._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar14,auVar25,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar35._8_8_ = dVar3;
    auVar35._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar35,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)local_118.m_storage.m_data & 7) == 0) &&
       (uVar6 = -((uint)((ulong)local_118.m_storage.m_data >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(local_118.m_storage.m_data,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 6) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 3;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar15._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar15._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar26._8_8_ = dVar2;
    auVar26._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar15,auVar26,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar36._8_8_ = dVar3;
    auVar36._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar36,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 9) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 6;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar16._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar16._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar27._8_8_ = dVar2;
    auVar27._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar16,auVar27,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar37._8_8_ = dVar3;
    auVar37._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar37,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0xc) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 9;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar17._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar17._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar28._8_8_ = dVar2;
    auVar28._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar17,auVar28,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar38._8_8_ = dVar3;
    auVar38._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar38,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0xf) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 0xc;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar18._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar18._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar29._8_8_ = dVar2;
    auVar29._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar18,auVar29,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar39._8_8_ = dVar3;
    auVar39._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar39,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0x12) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 0xf;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar19._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar19._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar30._8_8_ = dVar2;
    auVar30._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar19,auVar30,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar40._8_8_ = dVar3;
    auVar40._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar40,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0x15) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 0x12;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[6].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar20._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar20._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar31._8_8_ = dVar2;
    auVar31._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar20,auVar31,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar41._8_8_ = dVar3;
    auVar41._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar41,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0x18) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 0x15;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[7].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar21._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar21._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar32._8_8_ = dVar2;
    auVar32._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar21,auVar32,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar42._8_8_ = dVar3;
    auVar42._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar42,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0x1b) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 0x18;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[8].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar22._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar22._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar33._8_8_ = dVar2;
    auVar33._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar22,auVar33,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar43._8_8_ = dVar3;
    auVar43._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar43,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    if (local_118.m_storage.m_rows < 0x1e) goto LAB_006c2172;
    pdVar11 = local_118.m_storage.m_data + 0x1b;
    peVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[9].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&peVar4->field_0x38;
    auVar23._0_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    auVar23._8_8_ =
         dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    dVar2 = *(double *)&peVar4->field_0x40;
    auVar34._8_8_ = dVar2;
    auVar34._0_8_ = dVar2;
    auVar14 = vfmadd231pd_fma(auVar23,auVar34,
                              *(undefined1 (*) [16])
                               ((this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 3));
    dVar3 = *(double *)&peVar4->field_0x48;
    auVar44._8_8_ = dVar3;
    auVar44._0_8_ = dVar3;
    local_e8 = vfmadd231pd_fma(auVar14,auVar44,
                               *(undefined1 (*) [16])
                                ((this->super_ChElementCorotational).A.
                                 super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    vStack_d8.m_value =
         (long)(dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] +
               dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] +
               dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]);
    uVar7 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar6 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
      uVar7 = uVar6;
    }
    if (uVar7 != 0) {
      memcpy(pdVar11,local_e8,(ulong)(uVar7 * 8));
    }
    if (uVar7 < 3) {
      uVar8 = (ulong)(uVar7 << 3);
      memcpy((void *)((long)pdVar11 + uVar8),local_e8 + uVar8,0x18 - uVar8);
    }
    local_60 = this->Volume;
    local_68 = (((this->Material).
                 super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_ChContinuumMaterial).density;
    iVar5 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[3])(this);
    if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_cols != local_118.m_storage.m_rows) goto LAB_006c2191;
    if (local_118.m_storage.m_rows < 0) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_006c21fb;
    }
    if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_rows != local_118.m_storage.m_rows) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    local_a0.m_other = (local_68 * local_60) / (double)iVar5;
    sStack_d0.m_other =
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    local_e8._8_8_ = local_118.m_storage.m_rows;
    local_b0.m_value = local_118.m_storage.m_rows;
    local_78.m_storage.m_data = (double *)0x0;
    local_78.m_storage.m_rows = 0;
    local_c8 = &this->StiffnessMatrix;
    local_c0 = (RhsNested)&local_118;
    local_98 = (RhsNested)&local_118;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_78,local_118.m_storage.m_rows,1);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_e8,&local_f9);
    if (local_f8.m_storage.m_rows != local_78.m_storage.m_rows) {
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    uVar8 = local_f8.m_storage.m_rows + 7;
    if (-1 < local_f8.m_storage.m_rows) {
      uVar8 = local_f8.m_storage.m_rows;
    }
    uVar8 = uVar8 & 0xfffffffffffffff8;
    if (7 < local_f8.m_storage.m_rows) {
      lVar10 = 0;
      do {
        auVar12 = vaddpd_avx512f(*(undefined1 (*) [64])(local_78.m_storage.m_data + lVar10),
                                 *(undefined1 (*) [64])(local_f8.m_storage.m_data + lVar10));
        *(undefined1 (*) [64])(local_f8.m_storage.m_data + lVar10) = auVar12;
        lVar10 = lVar10 + 8;
      } while (lVar10 < (long)uVar8);
    }
    if ((long)uVar8 < local_f8.m_storage.m_rows) {
      do {
        local_f8.m_storage.m_data[uVar8] =
             local_78.m_storage.m_data[uVar8] + local_f8.m_storage.m_data[uVar8];
        uVar8 = uVar8 + 1;
      } while (local_f8.m_storage.m_rows != uVar8);
    }
    if (-1 < local_f8.m_storage.m_rows) {
      uVar8 = local_f8.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < local_f8.m_storage.m_rows) {
        uVar9 = 0;
        auVar12 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        do {
          auVar13 = vxorpd_avx512dq(auVar12,*(undefined1 (*) [64])
                                             (local_f8.m_storage.m_data + uVar9));
          *(undefined1 (*) [64])(local_f8.m_storage.m_data + uVar9) = auVar13;
          uVar9 = uVar9 + 8;
        } while (uVar9 < uVar8);
      }
      if ((long)uVar8 < local_f8.m_storage.m_rows) {
        do {
          auVar24._0_8_ = -local_f8.m_storage.m_data[uVar8];
          auVar24._8_8_ = 0x8000000000000000;
          dVar1 = (double)vmovlpd_avx(auVar24);
          local_f8.m_storage.m_data[uVar8] = dVar1;
          uVar8 = uVar8 + 1;
        } while (local_f8.m_storage.m_rows != uVar8);
      }
      local_c0 = (RhsNested)0x0;
      IStack_b8 = 0;
      local_b0.m_value = 0;
      local_e8._8_8_ = local_f8.m_storage.m_rows;
      local_e8._0_8_ = local_f8.m_storage.m_data;
      vStack_d8.m_value = 1;
      sStack_d0.m_other = 4.94065645841247e-324;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value =
           (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 1;
      if (local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value < 0 &&
          local_58.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                     );
      }
      local_58.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 1;
      ChMatrixCorotation::ComputeCK
                ((ChMatrixConstRef)local_e8,&(this->super_ChElementCorotational).A,10,&local_58);
      if (local_c0 != (RhsNested)0x0) {
        free((void *)local_c0[-1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
      }
      if (local_78.m_storage.m_data != (double *)0x0) {
        free((void *)local_78.m_storage.m_data[-1]);
      }
      if (local_f8.m_storage.m_data != (double *)0x0) {
        free((void *)local_f8.m_storage.m_data[-1]);
      }
      if (local_118.m_storage.m_data != (double *)0x0) {
        free((void *)local_118.m_storage.m_data[-1]);
      }
      return;
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_006c21fb:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

void ChElementTetraCorot_10::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == GetNdofs());

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    // nodal speeds, local
    displ.segment(0, 3) = A.transpose() * nodes[0]->pos_dt.eigen();
    displ.segment(3, 3) = A.transpose() * nodes[1]->pos_dt.eigen();
    displ.segment(6, 3) = A.transpose() * nodes[2]->pos_dt.eigen();
    displ.segment(9, 3) = A.transpose() * nodes[3]->pos_dt.eigen();
    displ.segment(12, 3) = A.transpose() * nodes[4]->pos_dt.eigen();
    displ.segment(15, 3) = A.transpose() * nodes[5]->pos_dt.eigen();
    displ.segment(18, 3) = A.transpose() * nodes[6]->pos_dt.eigen();
    displ.segment(21, 3) = A.transpose() * nodes[7]->pos_dt.eigen();
    displ.segment(24, 3) = A.transpose() * nodes[8]->pos_dt.eigen();
    displ.segment(27, 3) = A.transpose() * nodes[9]->pos_dt.eigen();

    double lumped_node_mass = (GetVolume() * Material->Get_density()) / GetNnodes();
    ChVectorDynamic<> FiR_local =
        Material->Get_RayleighDampingK() * (StiffnessMatrix * displ + lumped_node_mass * displ);
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 10, Fi);
}